

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<GraphContigger> * __thiscall
pybind11::class_<GraphContigger>::
def<void(GraphContigger::*)(PairedReadsDatastore_const&,int,int,float,bool,bool,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (class_<GraphContigger> *this,char *name_,offset_in_Node_to_subr *f,arg *extra,
          arg *extra_1,arg *extra_2,arg_v *extra_3,arg_v *extra_4,arg_v *extra_5,arg_v *extra_6)

{
  is_method *extra_1_00;
  arg_v *in_RCX;
  arg_v *in_RDX;
  name *extra_00;
  sibling *in_RSI;
  handle *in_RDI;
  arg_v *in_R8;
  arg_v *in_R9;
  cpp_function cf;
  handle *in_stack_fffffffffffffef8;
  sibling *in_stack_ffffffffffffff00;
  none *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  handle in_stack_ffffffffffffff20;
  handle in_stack_ffffffffffffff28;
  offset_in_Node_to_subr in_stack_ffffffffffffff68;
  cpp_function *in_stack_ffffffffffffff78;
  is_method local_60;
  name local_58;
  arg *extra_3_00;
  arg *extra_4_00;
  arg *in_stack_ffffffffffffffc0;
  
  extra_3_00 = (arg *)(in_RDX->super_arg).name;
  extra_4_00 = *(arg **)&(in_RDX->super_arg).field_0x8;
  extra_1_00 = (is_method *)
               _GraphContigger___pybind11__method_adaptor<GraphContigger,void,GraphContigger,PairedReadsDatastore_const&,int,int,float,bool,bool,bool>_void_GraphContigger_____PairedReadsDatastore_const__int_int_float_bool_bool_bool___
                         (extra_3_00,(offset_in_Node_to_subr)extra_4_00);
  pybind11::name::name(&local_58,(char *)in_RSI);
  is_method::is_method(&local_60,in_RDI);
  none::none(in_stack_ffffffffffffff10);
  getattr(in_stack_ffffffffffffff28,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  sibling::sibling(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  cpp_function::
  cpp_function<void,GraphContigger,PairedReadsDatastore_const&,int,int,float,bool,bool,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff68,extra_00,extra_1_00,in_RSI,
             extra_3_00,extra_4_00,in_stack_ffffffffffffffc0,in_R9,in_R8,in_RCX,in_RDX);
  object::~object((object *)0x286337);
  none::~none((none *)0x286344);
  pybind11::detail::add_class_method
            ((object *)in_stack_ffffffffffffffc0,(char *)extra_4_00,(cpp_function *)extra_3_00);
  cpp_function::~cpp_function((cpp_function *)0x28636d);
  return (class_<GraphContigger> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }